

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublylinkedlist.c
# Opt level: O3

int DList_RemoveEntryList(PDLIST_ENTRY Entry)

{
  DLIST_ENTRY_TAG *pDVar1;
  DLIST_ENTRY_TAG *pDVar2;
  
  pDVar1 = Entry->Flink;
  pDVar2 = Entry->Blink;
  pDVar2->Flink = pDVar1;
  pDVar1->Blink = pDVar2;
  return (int)(pDVar1 == pDVar2);
}

Assistant:

int
DList_RemoveEntryList(
    PDLIST_ENTRY Entry
)
{
    /* Codes_SRS_DLIST_06_008: [DList_RemoveEntryList shall remove a listEntry from whatever list it is properly part of.] */
    /* Codes_SRS_DLIST_06_009: [The remaining list is properly formed.] */
    /* Codes_SRS_DLIST_06_010: [DList_RemoveEntryList shall return non-zero if the remaining list is empty.] */
    /* Codes_SRS_DLIST_06_011: [DList_RemoveEntryList shall return zero if the remaining list is NOT empty.] */
    PDLIST_ENTRY Blink;
    PDLIST_ENTRY Flink;

    Flink = Entry->Flink;
    Blink = Entry->Blink;
    Blink->Flink = Flink;
    Flink->Blink = Blink;
    return (Flink == Blink);
}